

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::r_formatter<spdlog::details::null_scoped_padder>::format
          (r_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_2,tm *tm_time,
          memory_buf_t *dest)

{
  string_view_t view;
  size_t sVar1;
  memory_buf_t *in_RCX;
  tm *in_RDX;
  long in_RDI;
  null_scoped_padder p;
  size_t field_size;
  char *in_stack_ffffffffffffffa8;
  undefined1 *puVar2;
  buffer<char> *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  null_scoped_padder in_stack_ffffffffffffffc7;
  char *pcVar6;
  
  pcVar6 = (char *)0xb;
  null_scoped_padder::null_scoped_padder
            ((null_scoped_padder *)&stack0xffffffffffffffc7,0xb,(padding_info *)(in_RDI + 8),in_RCX)
  ;
  to12h(in_RDX);
  fmt_helper::pad2((int)((ulong)in_RDX >> 0x20),in_RCX);
  uVar5 = 0x3a;
  ::fmt::v8::detail::buffer<char>::push_back(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  fmt_helper::pad2((int)((ulong)in_RDX >> 0x20),in_RCX);
  uVar4 = 0x3a;
  ::fmt::v8::detail::buffer<char>::push_back(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  fmt_helper::pad2((int)((ulong)in_RDX >> 0x20),in_RCX);
  uVar3 = 0x20;
  ::fmt::v8::detail::buffer<char>::push_back(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  ampm(in_RDX);
  puVar2 = &stack0xffffffffffffffb0;
  sVar1 = std::char_traits<char>::length((char_type *)0x17be07);
  *(size_t *)(puVar2 + 8) = sVar1;
  view.size_ = (size_t)in_RCX;
  view.data_ = pcVar6;
  fmt_helper::append_string_view
            (view,(memory_buf_t *)
                  CONCAT17(in_stack_ffffffffffffffc7,
                           CONCAT16(uVar5,CONCAT15(uVar4,CONCAT14(uVar3,in_stack_ffffffffffffffc0)))
                          ));
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 11;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::pad2(to12h(tm_time), dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
        dest.push_back(' ');
        fmt_helper::append_string_view(ampm(tm_time), dest);
    }